

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FFontChar2::MakeTexture(FFontChar2 *this)

{
  ushort uVar1;
  ushort uVar2;
  BYTE *pBVar3;
  bool bVar4;
  byte bVar5;
  byte *pbVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  BYTE color;
  BYTE buff [16];
  FWadLump lump;
  byte local_a9;
  FFontChar2 *local_a8;
  uint local_9c;
  byte local_98 [3];
  char local_95;
  byte local_92;
  char local_8c;
  undefined8 local_80;
  ulong local_78;
  FWadLump local_70;
  long local_38;
  
  FWadCollection::OpenLumpNum(&local_70,&Wads,*(int *)&(this->super_FTexture).field_0x54);
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  local_a8 = this;
  FWadLump::Read(&local_70,local_98,4);
  if (local_95 == '\x1a') {
    FWadLump::Read(&local_70,local_98,0xd);
    FWadLump::Seek(&local_70,(long)local_a8->SourcePos + -0x11,1);
    bVar8 = local_8c - 1;
    bVar4 = false;
  }
  else if (local_95 == '2') {
    FWadLump::Read(&local_70,local_98,7);
    bVar4 = true;
    FWadLump::Seek(&local_70,(long)local_a8->SourcePos + -0xb,1);
    bVar8 = local_92;
  }
  else {
    FWadLump::Seek(&local_70,(long)local_a8->SourcePos + -4,1);
    bVar8 = 0xff;
    bVar4 = true;
  }
  uVar10 = (ulong)uVar2 * (ulong)uVar1;
  pbVar6 = (byte *)operator_new__(uVar10);
  local_a8->Pixels = pbVar6;
  uVar11 = (ulong)(local_a8->super_FTexture).Height;
  local_80 = uVar10 - 1;
  if (bVar4) {
    if (uVar11 != 0) {
      local_38 = -(long)(int)(uint)local_80;
      local_9c = 0;
      uVar10 = local_80 >> 0x20;
      local_80 = CONCAT44((int)uVar10,(uint)bVar8);
      iVar7 = 0;
      iVar9 = 0;
      local_78 = uVar11;
      do {
        uVar12 = (uint)(local_a8->super_FTexture).Width;
        while (uVar12 != 0) {
          if (iVar9 == 0) {
            if (iVar7 == 0) {
              (*local_70.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                        (&local_70,local_98,1);
              if ((char)local_98[0] < '\0') {
                iVar9 = 0;
                if (local_98[0] == 0x80) {
                  iVar7 = 0;
                }
                else {
                  (*local_70.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                            (&local_70,&local_a9,1);
                  local_9c = (uint)local_a9;
                  if (bVar8 <= local_a9) {
                    local_9c = (uint)local_80;
                  }
                  pBVar3 = local_a8->SourceRemap;
                  if (pBVar3 != (BYTE *)0x0) {
                    local_9c = (uint)CONCAT71((int7)((ulong)pBVar3 >> 8),pBVar3[local_9c & 0xff]);
                  }
                  iVar7 = 1 - (char)local_98[0];
                }
              }
              else {
                iVar9 = local_98[0] + 1;
                iVar7 = 0;
              }
            }
            else {
              *pbVar6 = (byte)local_9c;
              pbVar6 = pbVar6 + local_78;
              uVar12 = uVar12 - 1;
              iVar7 = iVar7 + -1;
              iVar9 = 0;
            }
          }
          else {
            (*local_70.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_70,local_98,1);
            uVar10 = (ulong)local_98[0];
            if (bVar8 <= local_98[0]) {
              uVar10 = local_80 & 0xffffffff;
            }
            local_98[0] = (byte)uVar10;
            bVar5 = local_98[0];
            if (local_a8->SourceRemap != (BYTE *)0x0) {
              bVar5 = local_a8->SourceRemap[uVar10 & 0xff];
            }
            *pbVar6 = bVar5;
            pbVar6 = pbVar6 + local_78;
            uVar12 = uVar12 - 1;
            iVar9 = iVar9 + -1;
          }
        }
        pbVar6 = pbVar6 + local_38;
        uVar12 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar12;
      } while (uVar12 != 0);
    }
  }
  else if (uVar11 != 0) {
    local_80 = -local_80;
    uVar10 = uVar11;
    do {
      local_78 = CONCAT44(local_78._4_4_,(int)uVar10);
      uVar1 = (local_a8->super_FTexture).Width;
      uVar12 = (uint)uVar1;
      if (uVar1 != 0) {
        do {
          (*local_70.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                    (&local_70,local_98,1);
          if (bVar8 < local_98[0]) {
            local_98[0] = bVar8;
          }
          bVar5 = local_98[0];
          if (local_a8->SourceRemap != (BYTE *)0x0) {
            bVar5 = local_a8->SourceRemap[local_98[0]];
          }
          *pbVar6 = bVar5;
          pbVar6 = pbVar6 + uVar11;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      pbVar6 = pbVar6 + local_80;
      uVar10 = (ulong)((int)local_78 - 1U);
    } while ((int)local_78 - 1U != 0);
  }
  FWadLump::~FWadLump(&local_70);
  return;
}

Assistant:

void FFontChar2::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	int destSize = Width * Height;
	BYTE max = 255;
	bool rle = true;

	// This is to "fix" bad fonts
	{
		BYTE buff[16];
		lump.Read (buff, 4);
		if (buff[3] == '2')
		{
			lump.Read (buff, 7);
			max = buff[6];
			lump.Seek (SourcePos - 11, SEEK_CUR);
		}
		else if (buff[3] == 0x1A)
		{
			lump.Read(buff, 13);
			max = buff[12] - 1;
			lump.Seek (SourcePos - 17, SEEK_CUR);
			rle = false;
		}
		else
		{
			lump.Seek (SourcePos - 4, SEEK_CUR);
		}
	}

	Pixels = new BYTE[destSize];

	int runlen = 0, setlen = 0;
	BYTE setval = 0;  // Shut up, GCC!
	BYTE *dest_p = Pixels;
	int dest_adv = Height;
	int dest_rew = destSize - 1;

	if (rle)
	{
		for (int y = Height; y != 0; --y)
		{
			for (int x = Width; x != 0; )
			{
				if (runlen != 0)
				{
					BYTE color;

					lump >> color;
					color = MIN (color, max);
					if (SourceRemap != NULL)
					{
						color = SourceRemap[color];
					}
					*dest_p = color;
					dest_p += dest_adv;
					x--;
					runlen--;
				}
				else if (setlen != 0)
				{
					*dest_p = setval;
					dest_p += dest_adv;
					x--;
					setlen--;
				}
				else
				{
					SBYTE code;

					lump >> code;
					if (code >= 0)
					{
						runlen = code + 1;
					}
					else if (code != -128)
					{
						BYTE color;

						lump >> color;
						setlen = (-code) + 1;
						setval = MIN (color, max);
						if (SourceRemap != NULL)
						{
							setval = SourceRemap[setval];
						}
					}
				}
			}
			dest_p -= dest_rew;
		}
	}
	else
	{
		for (int y = Height; y != 0; --y)
		{
			for (int x = Width; x != 0; --x)
			{
				BYTE color;
				lump >> color;
				if (color > max)
				{
					color = max;
				}
				if (SourceRemap != NULL)
				{
					color = SourceRemap[color];
				}
				*dest_p = color;
				dest_p += dest_adv;
			}
			dest_p -= dest_rew;
		}
	}

	if (destSize < 0)
	{
		char name[9];
		Wads.GetLumpName (name, SourceLump);
		name[8] = 0;
		I_FatalError ("The font %s is corrupt", name);
	}
}